

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pool_block.cpp
# Opt level: O1

void __thiscall cppnet::BlockMemoryPool::~BlockMemoryPool(BlockMemoryPool *this)

{
  pointer ppvVar1;
  pointer ppvVar2;
  
  this->_vptr_BlockMemoryPool = (_func_int **)&PTR__BlockMemoryPool_00124748;
  ppvVar1 = (this->_free_mem_vec).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppvVar2 = (this->_free_mem_vec).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                 super__Vector_impl_data._M_start; ppvVar2 != ppvVar1; ppvVar2 = ppvVar2 + 1) {
    free(*ppvVar2);
    ppvVar1 = (this->_free_mem_vec).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
  }
  ppvVar2 = (this->_free_mem_vec).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppvVar1 != ppvVar2) {
    (this->_free_mem_vec).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppvVar2;
  }
  if (ppvVar2 != (pointer)0x0) {
    operator_delete(ppvVar2);
    return;
  }
  return;
}

Assistant:

BlockMemoryPool::~BlockMemoryPool() {
#ifdef __use_iocp__
    std::lock_guard<std::mutex> lock(_mutex);
#endif
    // free all memory
    for (auto iter = _free_mem_vec.begin(); iter != _free_mem_vec.end(); ++iter) {
        free(*iter);
    }
    _free_mem_vec.clear();
}